

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EdExplFinder.cpp
# Opt level: O3

void __thiscall EdExplFinder::bfs_shortest_path(EdExplFinder *this)

{
  ulong *puVar1;
  pointer piVar2;
  bool bVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  deque<std::pair<int,int>,std::allocator<std::pair<int,int>>> *this_00;
  key_type *pkVar6;
  const_iterator cVar7;
  int iVar8;
  difference_type __n;
  long lVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  vector<bool,_std::allocator<bool>_> *pvVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  pair<std::_Rb_tree_iterator<std::pair<int,_int>_>,_std::_Rb_tree_iterator<std::pair<int,_int>_>_>
  pVar22;
  pair<int,_int> node;
  pair<int,_int> start_node;
  pair<int,_int> currentNode;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  node_set;
  key_type local_b0;
  int local_a4;
  ulong local_a0;
  pair<int,_int> local_98;
  deque<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_90;
  vector<int,_std::allocator<int>_> *local_88;
  ulong local_80;
  key_type local_78;
  ulong local_70;
  ulong local_68;
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  local_60;
  
  pvVar5 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  iVar18 = this->seqSize + 1;
  local_60._M_impl._0_4_ = this->lb + 1;
  std::vector<int,_std::allocator<int>_>::vector
            (pvVar5,(ulong)(uint)(iVar18 * iVar18),(value_type_conflict1 *)&local_60,
             (allocator_type *)&local_98);
  (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [(this->seqSize + 2) * this->seqSize] = 0;
  this_00 = (deque<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)operator_new(0x50);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  *(undefined8 *)(this_00 + 0x10) = 0;
  *(undefined8 *)(this_00 + 0x18) = 0;
  *(undefined8 *)(this_00 + 0x20) = 0;
  *(undefined8 *)(this_00 + 0x28) = 0;
  *(undefined8 *)(this_00 + 0x30) = 0;
  *(undefined8 *)(this_00 + 0x38) = 0;
  *(undefined8 *)(this_00 + 0x40) = 0;
  *(undefined8 *)(this_00 + 0x48) = 0;
  std::_Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_initialize_map
            ((_Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this_00,0);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98.first = this->seqSize;
  local_98.second = local_98.first;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (*(undefined8 **)(this_00 + 0x30) == (undefined8 *)(*(long *)(this_00 + 0x40) + -8)) {
    std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    _M_push_back_aux<std::pair<int,int>const&>(this_00,&local_98);
  }
  else {
    **(undefined8 **)(this_00 + 0x30) = CONCAT44(local_98.first,local_98.first);
    *(long *)(this_00 + 0x30) = *(long *)(this_00 + 0x30) + 8;
  }
  std::
  _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
  ::_M_insert_unique<std::pair<int,int>const&>
            ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
              *)&local_60,&local_98);
  local_70 = (long)this->lb / (long)this->min_id_cost & 0xffffffff;
  pkVar6 = *(key_type **)(this_00 + 0x10);
  if (*(key_type **)(this_00 + 0x30) != pkVar6) {
    local_a0 = 0x800000000000003f;
    local_90 = this_00;
    local_88 = pvVar5;
    do {
      pvVar5 = local_88;
      local_78 = *pkVar6;
      std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::pop_front
                ((deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_90);
      pVar22 = std::
               _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
               ::equal_range(&local_60,&local_78);
      std::
      _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
      ::_M_erase_aux(&local_60,(_Base_ptr)pVar22.first._M_node,(_Base_ptr)pVar22.second._M_node);
      pvVar4 = local_88;
      iVar12 = local_78.first;
      local_80 = (ulong)local_78 & 0xffffffff;
      uVar19 = (ulong)(uint)local_78.second;
      iVar18 = this->seqSize;
      iVar20 = (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[(iVar18 + 1) * local_78.first + local_78.second];
      if (iVar20 < this->lb) {
        uVar16 = local_78.second - 1;
        local_a4 = iVar20;
        local_68 = uVar19;
        if (local_78.first - (int)local_70 < local_78.second && 0 < local_78.second) {
          iVar17 = this->max_char;
          uVar11 = 0;
          if (local_78.second <= iVar18) {
            uVar19 = (ulong)uVar16 * ((long)iVar17 + 1);
            iVar18 = (iVar18 - local_78.second) + 1;
            do {
              iVar14 = (int)uVar19;
              iVar8 = iVar14 + 0x3f;
              if (-1 < iVar14) {
                iVar8 = iVar14;
              }
              if (((this->seq2ExcludedCharacters->super__Bvector_base<std::allocator<bool>_>).
                   _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [(long)(iVar8 >> 6) +
                    (ulong)((uVar19 & local_a0) < 0x8000000000000001) + 0xffffffffffffffff] >>
                   (uVar19 & 0x3f) & 1) != 0) {
                uVar11 = 1;
                break;
              }
              uVar19 = uVar19 + (long)iVar17 + 1;
              iVar18 = iVar18 + -1;
              uVar11 = 0;
            } while (iVar18 != 0);
          }
          if ((int)uVar11 <= iVar17) {
            uVar19 = (ulong)uVar11;
            do {
              if (uVar19 == 0) {
                iVar18 = 0;
              }
              else {
                iVar18 = this->insertion_cost->data[(int)uVar19 - 1];
              }
              uVar11 = (this->seqSize + 1) * iVar12 + uVar16;
              iVar18 = iVar18 + iVar20;
              if (this->dpMatrix->data[uVar11] + iVar18 < this->lb) {
                lVar9 = (iVar17 + 1) * uVar16 + uVar19;
                iVar14 = (int)lVar9;
                iVar18 = iVar14 + 0x3f;
                if (-1 < iVar14) {
                  iVar18 = iVar14;
                }
                puVar1 = (this->seq2ExcludedCharacters->super__Bvector_base<std::allocator<bool>_>).
                         _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                         (long)(iVar18 >> 6) +
                         (ulong)(((long)iVar14 & local_a0) < 0x8000000000000001) +
                         0xffffffffffffffff;
                *puVar1 = *puVar1 | 1L << ((byte)lVar9 & 0x3f);
              }
              else {
                piVar2 = (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                iVar20 = piVar2[(int)uVar11];
                if (iVar18 < iVar20) {
                  iVar20 = iVar18;
                }
                piVar2[(int)uVar11] = iVar20;
                local_b0.first = iVar12;
                local_b0.second = uVar16;
                cVar7 = std::
                        _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                        ::find(&local_60,&local_b0);
                if ((_Rb_tree_header *)cVar7._M_node == &local_60._M_impl.super__Rb_tree_header) {
                  if (*(undefined8 **)(local_90 + 0x30) ==
                      (undefined8 *)(*(long *)(local_90 + 0x40) + -8)) {
                    std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                    _M_push_back_aux<std::pair<int,int>const&>(local_90,&local_b0);
                  }
                  else {
                    **(undefined8 **)(local_90 + 0x30) = CONCAT44(local_b0.second,local_b0.first);
                    *(long *)(local_90 + 0x30) = *(long *)(local_90 + 0x30) + 8;
                  }
                  std::
                  _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                  ::_M_insert_unique<std::pair<int,int>const&>
                            ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                              *)&local_60,&local_b0);
                }
                iVar17 = this->max_char;
                iVar20 = local_a4;
              }
              bVar3 = (long)uVar19 < (long)iVar17;
              uVar19 = uVar19 + 1;
            } while (bVar3);
          }
        }
        pvVar5 = local_88;
        if (0 < iVar12) {
          iVar12 = (int)local_80;
          uVar21 = iVar12 - 1;
          iVar18 = this->max_char;
          uVar11 = (uint)local_68;
          if ((int)uVar11 < iVar12 + (int)local_70) {
            lVar9 = 0;
            if (iVar12 <= this->seqSize) {
              uVar19 = (ulong)uVar21 * ((long)iVar18 + 1);
              iVar12 = (this->seqSize - iVar12) + 1;
              do {
                iVar20 = (int)uVar19;
                iVar17 = iVar20 + 0x3f;
                if (-1 < iVar20) {
                  iVar17 = iVar20;
                }
                iVar20 = local_a4;
                if (((this->seq1ExcludedCharacters->super__Bvector_base<std::allocator<bool>_>).
                     _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [(long)(iVar17 >> 6) +
                      (ulong)((uVar19 & local_a0) < 0x8000000000000001) + 0xffffffffffffffff] >>
                     (uVar19 & 0x3f) & 1) != 0) {
                  lVar9 = 1;
                  break;
                }
                uVar19 = uVar19 + (long)iVar18 + 1;
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
            }
            if (iVar18 < (int)lVar9) goto LAB_0016d5dc;
            do {
              if (lVar9 == 0) {
                iVar12 = 0;
              }
              else {
                iVar12 = this->deletion_cost->data[(int)lVar9 - 1];
              }
              uVar13 = (this->seqSize + 1) * uVar21 + uVar11;
              iVar12 = iVar12 + iVar20;
              if (this->dpMatrix->data[uVar13] + iVar12 < this->lb) {
                lVar10 = (ulong)((iVar18 + 1) * uVar21) + lVar9;
                iVar17 = (int)lVar10;
                iVar12 = iVar17 + 0x3f;
                if (-1 < iVar17) {
                  iVar12 = iVar17;
                }
                puVar1 = (this->seq1ExcludedCharacters->super__Bvector_base<std::allocator<bool>_>).
                         _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                         (long)(iVar12 >> 6) +
                         (ulong)(((long)iVar17 & local_a0) < 0x8000000000000001) +
                         0xffffffffffffffff;
                *puVar1 = *puVar1 | 1L << ((byte)lVar10 & 0x3f);
              }
              else {
                piVar2 = (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                iVar18 = piVar2[(int)uVar13];
                if (iVar12 < iVar18) {
                  iVar18 = iVar12;
                }
                piVar2[(int)uVar13] = iVar18;
                local_b0.first = uVar21;
                local_b0.second = uVar11;
                cVar7 = std::
                        _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                        ::find(&local_60,&local_b0);
                if ((_Rb_tree_header *)cVar7._M_node == &local_60._M_impl.super__Rb_tree_header) {
                  if (*(undefined8 **)(local_90 + 0x30) ==
                      (undefined8 *)(*(long *)(local_90 + 0x40) + -8)) {
                    std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                    _M_push_back_aux<std::pair<int,int>const&>(local_90,&local_b0);
                  }
                  else {
                    **(undefined8 **)(local_90 + 0x30) = CONCAT44(local_b0.second,local_b0.first);
                    *(long *)(local_90 + 0x30) = *(long *)(local_90 + 0x30) + 8;
                  }
                  std::
                  _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                  ::_M_insert_unique<std::pair<int,int>const&>
                            ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                              *)&local_60,&local_b0);
                }
                iVar18 = this->max_char;
                iVar20 = local_a4;
              }
              bVar3 = lVar9 < iVar18;
              lVar9 = lVar9 + 1;
            } while (bVar3);
            iVar18 = this->max_char;
          }
          if (0 < iVar18 && 0 < (int)uVar11) {
            iVar12 = 0;
            local_80 = local_80 << 4;
            lVar9 = 1;
            do {
              if (0 < iVar18) {
                iVar17 = 0;
                do {
                  uVar11 = (this->seqSize + 1) * uVar21 + uVar16;
                  iVar14 = this->substitution_cost->data[(uint)(iVar12 * iVar18 + iVar17)] + iVar20;
                  if (this->dpMatrix->data[uVar11] + iVar14 < this->lb) {
                    lVar10 = *(long *)((long)&this->seq1[-1].var + local_80);
                    if (((lVar9 < *(int *)(lVar10 + 0xc)) || (*(int *)(lVar10 + 0x10) < lVar9)) ||
                       ((*(long *)(lVar10 + 0x28) != 0 &&
                        (*(char *)(*(long *)(lVar10 + 0x28) + lVar9) == '\0')))) {
                      pvVar15 = this->seq1ExcludedCharacters;
                      iVar14 = (iVar18 + 1) * uVar21;
                      iVar8 = iVar14 + (int)lVar9;
                      iVar14 = iVar14 + (int)lVar9 + 0x3f;
                    }
                    else {
                      pvVar15 = this->seq2ExcludedCharacters;
                      iVar14 = (iVar18 + 1) * uVar16;
                      iVar8 = iVar14 + iVar17 + 1;
                      iVar14 = iVar14 + iVar17 + 0x40;
                    }
                    if (-1 < iVar8) {
                      iVar14 = iVar8;
                    }
                    puVar1 = (pvVar15->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                             (long)(iVar14 >> 6) +
                             (ulong)(((long)iVar8 & local_a0) < 0x8000000000000001) +
                             0xffffffffffffffff;
                    *puVar1 = *puVar1 | 1L << ((byte)iVar8 & 0x3f);
                  }
                  else {
                    piVar2 = (local_88->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start;
                    iVar18 = piVar2[(int)uVar11];
                    if (iVar14 < iVar18) {
                      iVar18 = iVar14;
                    }
                    piVar2[(int)uVar11] = iVar18;
                    local_b0.first = uVar21;
                    local_b0.second = uVar16;
                    cVar7 = std::
                            _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                            ::find(&local_60,&local_b0);
                    if ((_Rb_tree_header *)cVar7._M_node == &local_60._M_impl.super__Rb_tree_header)
                    {
                      if (*(undefined8 **)(local_90 + 0x30) ==
                          (undefined8 *)(*(long *)(local_90 + 0x40) + -8)) {
                        std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                        _M_push_back_aux<std::pair<int,int>const&>(local_90,&local_b0);
                      }
                      else {
                        **(undefined8 **)(local_90 + 0x30) =
                             CONCAT44(local_b0.second,local_b0.first);
                        *(long *)(local_90 + 0x30) = *(long *)(local_90 + 0x30) + 8;
                      }
                      std::
                      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                      ::_M_insert_unique<std::pair<int,int>const&>
                                ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                                  *)&local_60,&local_b0);
                    }
                    iVar18 = this->max_char;
                    iVar20 = local_a4;
                  }
                  iVar17 = iVar17 + 1;
                } while (iVar17 < iVar18);
              }
              iVar12 = iVar12 + 1;
              bVar3 = lVar9 < iVar18;
              lVar9 = lVar9 + 1;
            } while (bVar3);
          }
        }
      }
LAB_0016d5dc:
      pkVar6 = *(key_type **)(local_90 + 0x10);
      pvVar5 = local_88;
      this_00 = local_90;
    } while (*(key_type **)(local_90 + 0x30) != pkVar6);
  }
  piVar2 = (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  operator_delete(pvVar5);
  std::_Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Deque_base
            ((_Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this_00);
  operator_delete(this_00);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void EdExplFinder::bfs_shortest_path() {
	auto* shortestPathMatrix =
			new std::vector<int>(static_cast<size_t>((seqSize + 1) * (seqSize + 1)), lb + 1);
	// set shortest path for bottom right position to 0 cost
	(*shortestPathMatrix)[matrixCoord(seqSize, seqSize)] = 0;

	auto* nodeQueue = new std::queue<std::pair<int, int> >();
	std::set<std::pair<int, int> > node_set;
	// start with bottom right position
	const std::pair<int, int> start_node = std::pair<int, int>(seqSize, seqSize);
	nodeQueue->push(start_node);
	node_set.insert(start_node);

	// d = distance to diagonal that should be calculated in the matrix
	const int d = lb / min_id_cost;

	while (!nodeQueue->empty()) {
		const std::pair<int, int> currentNode = nodeQueue->front();
		nodeQueue->pop();
		node_set.erase(currentNode);

		const int i = currentNode.first;
		const int j = currentNode.second;

		const int s_ij = (*shortestPathMatrix)[matrixCoord(i, j)];

		if (s_ij >= lb) {
			continue;
		}

		//
		// process move to the left
		//
		if (j - 1 >= 0 && j - 1 >= i - d) {
			// check if 0 is forbidden in any sequence position that is larger or equal than the current
			// position
			int cj_start = 0;
			for (int k = j - 1; k < seqSize; k++) {
				if ((*seq2ExcludedCharacters)[excludedCharCoord(k, 0)]) {
					// if 0 is forbidden, we do not need to include it in the explanation
					cj_start = 1;
					break;
				}
			}
			for (int c = cj_start; c <= max_char; c++) {
				const int ins_cost = c == 0 ? 0 : (*insertion_cost)[c - 1];
				const int d_ij_minus_1 = (*dpMatrix)[matrixCoord(i, j - 1)];
				if (d_ij_minus_1 + ins_cost + s_ij < lb) {
					// exclude character for position in explanation if a cheaper path could be established
					(*seq2ExcludedCharacters)[excludedCharCoord(j - 1, c)] = true;
				} else {
					// update costs and push node to queue
					const int s_ij_minus_1 = (*shortestPathMatrix)[matrixCoord(i, j - 1)];
					(*shortestPathMatrix)[matrixCoord(i, j - 1)] = std::min(s_ij_minus_1, s_ij + ins_cost);

					const std::pair<int, int> node = std::pair<int, int>(i, j - 1);
					if (node_set.count(node) == 0) {
						nodeQueue->push(node);
						node_set.insert(node);
					}
				}
			}
		}

		//
		// process upwards move
		//
		if (i - 1 >= 0 && j < i + d) {
			int ci_start = 0;
			// check if 0 is forbidden in any sequence position that is larger or equal than the current
			// position
			for (int k = i - 1; k < seqSize; k++) {
				if ((*seq1ExcludedCharacters)[excludedCharCoord(k, 0)]) {
					// if 0 is forbidden, we do not need to include it in the explanation
					ci_start = 1;
					break;
				}
			}
			for (int c = ci_start; c <= max_char; c++) {
				const int del_cost = c == 0 ? 0 : (*deletion_cost)[c - 1];
				const int d_i_minus_1_j = (*dpMatrix)[matrixCoord(i - 1, j)];
				if (d_i_minus_1_j + del_cost + s_ij < lb) {
					// exclude character for position in explanation if a cheaper path could be established
					(*seq1ExcludedCharacters)[excludedCharCoord(i - 1, c)] = true;
				} else {
					// update costs and push node to queue
					const int s_i_minus_1_j = (*shortestPathMatrix)[matrixCoord(i - 1, j)];
					(*shortestPathMatrix)[matrixCoord(i - 1, j)] = std::min(s_i_minus_1_j, s_ij + del_cost);

					const std::pair<int, int> node = std::pair<int, int>(i - 1, j);
					if (node_set.count(node) == 0) {
						nodeQueue->push(node);
						node_set.insert(node);
					}
				}
			}
		}

		//
		// process diagonal move
		//
		if (i - 1 >= 0 && j - 1 >= 0) {
			for (int c1 = 1; c1 <= max_char; c1++) {
				for (int c2 = 1; c2 <= max_char; c2++) {
					const int d_i_minus_1_j_minus_1 = (*dpMatrix)[matrixCoord(i - 1, j - 1)];
					const int subst_cost = (*substitution_cost)[substCoord(c1, c2)];

					if (d_i_minus_1_j_minus_1 + subst_cost + s_ij < lb) {
						// we can either exclude the character for seq1 or seq2
						if (seq1[i - 1].indomain(c1)) {
							// if seq1 contains c1, we exclude c2 from seq2
							(*seq2ExcludedCharacters)[excludedCharCoord(j - 1, c2)] = true;
						} else {
							// if seq2 contains c2, or neither seq1/seq2 contain c1/c2 we exclude c1 from seq1
							(*seq1ExcludedCharacters)[excludedCharCoord(i - 1, c1)] = true;
						}
					} else {
						const int s_i_minus_1_j_minus_1 = (*shortestPathMatrix)[matrixCoord(i - 1, j - 1)];
						(*shortestPathMatrix)[matrixCoord(i - 1, j - 1)] =
								std::min(s_i_minus_1_j_minus_1, s_ij + subst_cost);

						const std::pair<int, int> node = std::pair<int, int>(i - 1, j - 1);
						if (node_set.count(node) == 0) {
							nodeQueue->push(node);
							node_set.insert(node);
						}
					}
				}
			}
		}
	}

#ifndef NDEBUG
	debug_print(shortestPathMatrix);
#endif

	delete shortestPathMatrix;
	delete nodeQueue;
}